

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<Branching*>::vec<Branching*>(vec<Branching_*> *this,vec<Branching_*> *other)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  Branching **ppBVar4;
  vec<Branching_*> *in_RSI;
  uint *in_RDI;
  uint i;
  uint local_14;
  
  uVar2 = vec<Branching_*>::size(in_RSI);
  *in_RDI = uVar2;
  in_RDI[1] = *in_RDI;
  pvVar3 = malloc((ulong)in_RDI[1] << 3);
  *(void **)(in_RDI + 2) = pvVar3;
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    lVar1 = *(long *)(in_RDI + 2);
    ppBVar4 = vec<Branching_*>::operator[](in_RSI,local_14);
    *(Branching **)(lVar1 + (ulong)local_14 * 8) = *ppBVar4;
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}